

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXUtil.cpp
# Opt level: O0

string * Assimp::FBX::Util::AddOffset
                   (string *__return_storage_ptr__,string *prefix,string *text,size_t offset)

{
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar1;
  basic_formatter *this;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  size_t local_28;
  size_t offset_local;
  string *text_local;
  string *prefix_local;
  
  local_28 = offset;
  offset_local = (size_t)text;
  text_local = prefix;
  prefix_local = __return_storage_ptr__;
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
            (&local_1a0);
  pbVar1 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                      &local_1a0,text_local);
  pbVar1 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar1,(char (*) [12])" (offset 0x");
  pbVar1 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar1,std::hex);
  pbVar1 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar1,&local_28);
  pbVar1 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar1,(char (*) [3])0xb9e573);
  this = (basic_formatter *)
         Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                   (pbVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           offset_local);
  Formatter::basic_formatter::operator_cast_to_string(__return_storage_ptr__,this);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            (&local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string AddOffset(const std::string& prefix, const std::string& text, size_t offset)
{
    return static_cast<std::string>( (Formatter::format() << prefix << " (offset 0x" << std::hex << offset << ") " << text) );
}